

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O0

size_t UpdateNodes(size_t num_bytes,size_t block_start,size_t pos,uint8_t *ringbuffer,
                  size_t ringbuffer_mask,BrotliEncoderParams *params,size_t max_backward_limit,
                  int *starting_dist_cache,size_t num_matches,BackwardMatch *matches,
                  ZopfliCostModel *model,StartPosQueue *queue,ZopfliNode *nodes)

{
  float fVar1;
  uint uVar2;
  BackwardMatch BVar3;
  int iVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  uint32_t uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  PosData *pPVar14;
  BackwardMatch BVar15;
  size_t sVar16;
  ulong uVar17;
  ZopfliNode *pZVar18;
  ulong uVar19;
  long lVar20;
  BackwardMatch BVar21;
  bool bVar22;
  float fVar23;
  float fVar24;
  BackwardMatch local_4a8;
  BackwardMatch local_498;
  BackwardMatch local_490;
  ulong local_480;
  float local_474;
  size_t local_458;
  size_t local_450;
  float cost_1;
  uint16_t cmdcode_1;
  uint16_t copycode_1;
  size_t len_code;
  size_t max_match_len;
  float dist_cost_1;
  uint32_t distnumextra;
  uint32_t distextra;
  uint16_t dist_symbol;
  size_t dist_code;
  int is_dictionary_match;
  size_t dist;
  BackwardMatch match;
  size_t len_1;
  float cost;
  uint16_t cmdcode;
  uint16_t copycode;
  size_t l;
  float dist_cost;
  uint8_t continuation;
  size_t len;
  size_t prev_ix;
  size_t backward;
  size_t idx;
  size_t j;
  size_t best_len;
  float base_cost;
  float start_costdiff;
  uint16_t inscode;
  size_t start;
  PosData *posdata_1;
  float min_cost;
  PosData *posdata;
  size_t gap;
  size_t k;
  size_t result;
  size_t min_len;
  size_t max_iters;
  size_t max_zopfli_len;
  size_t max_len;
  size_t dictionary_start;
  size_t max_distance;
  size_t cur_ix_masked;
  size_t cur_ix;
  size_t stream_offset;
  BrotliEncoderParams *params_local;
  size_t ringbuffer_mask_local;
  uint8_t *ringbuffer_local;
  size_t pos_local;
  size_t block_start_local;
  size_t num_bytes_local;
  size_t nbits_2;
  size_t offset_1;
  size_t prefix;
  size_t postfix;
  size_t postfix_mask;
  size_t bucket;
  size_t dist_1;
  uint32_t nbits;
  ushort local_222;
  uint32_t nbits_3;
  ushort local_1fa;
  uint32_t nbits_1;
  ushort local_1d2;
  uint32_t offset_2;
  uint16_t bits64_1;
  uint32_t offset;
  uint16_t bits64;
  ushort local_19a;
  size_t matching_bits;
  uint64_t x;
  size_t limit2;
  size_t matched;
  ulong *local_170;
  size_t local_160;
  ZopfliNode *next_1;
  ZopfliNode *next;
  size_t code;
  
  uVar11 = block_start + pos;
  uVar12 = uVar11 & ringbuffer_mask;
  local_450 = uVar11;
  if (max_backward_limit <= uVar11) {
    local_450 = max_backward_limit;
  }
  local_458 = uVar11 + params->stream_offset;
  if (max_backward_limit <= local_458) {
    local_458 = max_backward_limit;
  }
  uVar13 = num_bytes - pos;
  iVar6 = 0x145;
  if (params->quality < 0xb) {
    iVar6 = 0x96;
  }
  iVar7 = 5;
  if (params->quality < 0xb) {
    iVar7 = 1;
  }
  k = 0;
  EvaluateNode(block_start + params->stream_offset,pos,max_backward_limit,0,starting_dist_cache,
               model,queue,nodes);
  pPVar14 = StartPosQueueAt(queue,0);
  BVar15 = (BackwardMatch)
           ComputeMinimumCopyLength
                     (pPVar14->cost + model->min_cost_cmd_ +
                      (model->literal_costs_[pos] - model->literal_costs_[pPVar14->pos]),nodes,
                      num_bytes,pos);
  gap = 0;
  do {
    bVar22 = false;
    if (gap < (ulong)(long)iVar7) {
      sVar16 = StartPosQueueSize(queue);
      bVar22 = gap < sVar16;
    }
    if (!bVar22) {
      return k;
    }
    pPVar14 = StartPosQueueAt(queue,gap);
    sVar16 = pPVar14->pos;
    uVar17 = pos - sVar16;
    if (uVar17 < 6) {
      local_222 = (ushort)uVar17;
    }
    else if (uVar17 < 0x82) {
      uVar9 = (int)uVar17 - 2;
      iVar4 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      local_222 = (short)(iVar4 + -1) * 2 + (short)(uVar17 - 2 >> ((byte)(iVar4 + -1) & 0x3f)) + 2;
    }
    else if (uVar17 < 0x842) {
      uVar9 = (int)uVar17 - 0x42;
      iVar4 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      local_222 = (short)iVar4 + 10;
    }
    else if (uVar17 < 0x1842) {
      local_222 = 0x15;
    }
    else if (uVar17 < 0x5842) {
      local_222 = 0x16;
    }
    else {
      local_222 = 0x17;
    }
    fVar23 = pPVar14->costdiff + (float)kInsExtra[local_222] +
             (model->literal_costs_[pos] - *model->literal_costs_);
    j = (long)BVar15 - 1;
    idx = 0;
    while( true ) {
      iVar4 = (int)sVar16;
      if (0xf < idx || uVar13 <= j) break;
      uVar8 = pPVar14->distance_cache[kDistanceCacheIndex[idx]] + kDistanceCacheOffset[idx];
      uVar17 = (ulong)(int)uVar8;
      if (ringbuffer_mask < uVar12 + j) break;
      if ((((uVar17 <= local_458) && (uVar17 <= local_450)) && (uVar11 - uVar17 < uVar11)) &&
         ((uVar17 = ringbuffer_mask & uVar11 - uVar17, uVar17 + j <= ringbuffer_mask &&
          (ringbuffer[uVar12 + j] == ringbuffer[uVar17 + j])))) {
        local_170 = (ulong *)(ringbuffer + uVar12);
        limit2 = 0;
        x = (uVar13 >> 3) + 1;
LAB_00136518:
        x = x - 1;
        if (x != 0) {
          if (*local_170 == *(ulong *)(ringbuffer + limit2 + uVar17)) goto LAB_0013657a;
          iVar10 = 0;
          for (uVar17 = *local_170 ^ *(ulong *)(ringbuffer + limit2 + uVar17); (uVar17 & 1) == 0;
              uVar17 = uVar17 >> 1 | 0x8000000000000000) {
            iVar10 = iVar10 + 1;
          }
          local_160 = ((ulong)(long)iVar10 >> 3) + limit2;
          goto LAB_001366bb;
        }
        matched = (uVar13 & 7) + 1;
        while (matched = matched - 1, matched != 0) {
          if (ringbuffer[limit2 + uVar17] != (uint8_t)*local_170) {
            local_160 = limit2;
            goto LAB_001366bb;
          }
          local_170 = (ulong *)((long)local_170 + 1);
          limit2 = limit2 + 1;
        }
        local_160 = limit2;
LAB_001366bb:
        fVar1 = model->cost_dist_[idx];
        while (_cost = j + 1, _cost <= local_160) {
          if (_cost < 10) {
            local_1d2 = (short)_cost - 2;
          }
          else if (_cost < 0x86) {
            uVar9 = (int)j - 5;
            iVar10 = 0x1f;
            if (uVar9 != 0) {
              for (; uVar9 >> iVar10 == 0; iVar10 = iVar10 + -1) {
              }
            }
            local_1d2 = (short)(iVar10 + -1) * 2 + (short)(j - 5 >> ((byte)(iVar10 + -1) & 0x3f)) +
                        4;
          }
          else if (_cost < 0x846) {
            uVar9 = (int)j - 0x45;
            iVar10 = 0x1f;
            if (uVar9 != 0) {
              for (; uVar9 >> iVar10 == 0; iVar10 = iVar10 + -1) {
              }
            }
            local_1d2 = (short)iVar10 + 0xc;
          }
          else {
            local_1d2 = 0x17;
          }
          local_19a = local_1d2 & 7 | (local_222 & 7) << 3;
          if (((idx == 0) && (local_222 < 8)) && (local_1d2 < 0x10)) {
            if (7 < local_1d2) {
              local_19a = local_19a | 0x40;
            }
          }
          else {
            iVar10 = ((int)(uint)local_1d2 >> 3) + ((int)(uint)local_222 >> 3) * 3;
            local_19a = (short)iVar10 * 0x40 + 0x40 +
                        ((ushort)(0x520d40 >> ((char)iVar10 * '\x02' & 0x1fU)) & 0xc0) | local_19a;
          }
          local_474 = fVar23 + fVar1;
          if (local_19a < 0x80) {
            local_474 = fVar23;
          }
          fVar24 = local_474 + (float)kCopyExtra[local_1d2] + model->cost_cmd_[local_19a];
          if (fVar24 < nodes[pos + _cost].u.cost) {
            pZVar18 = nodes + pos + _cost;
            pZVar18->length = (uint)_cost | 0x12000000;
            pZVar18->distance = uVar8;
            pZVar18->dcode_insert_length = ((int)idx + 1) * 0x8000000 | (int)pos - iVar4;
            (pZVar18->u).cost = fVar24;
            if (_cost < k) {
              local_480 = k;
            }
            else {
              local_480 = _cost;
            }
            k = local_480;
          }
          j = _cost;
        }
      }
      idx = idx + 1;
    }
    if (gap < 2) {
      match = BVar15;
      for (idx = 0; idx < num_matches; idx = idx + 1) {
        BVar3 = matches[idx];
        uVar17 = (ulong)BVar3 & 0xffffffff;
        uVar9 = (params->dist).num_direct_distance_codes;
        uVar2 = (params->dist).distance_postfix_bits;
        if (uVar17 + 0xf < (ulong)uVar9 + 0x10) {
          distnumextra._2_2_ = (ushort)(uVar17 + 0xf);
        }
        else {
          bVar5 = (byte)uVar2;
          uVar19 = (1L << (bVar5 + 2 & 0x3f)) + ((uVar17 - 1) - (ulong)uVar9);
          iVar10 = 0x1f;
          if ((uint)uVar19 != 0) {
            for (; (uint)uVar19 >> iVar10 == 0; iVar10 = iVar10 + -1) {
            }
          }
          lVar20 = (ulong)(iVar10 - 1U) - (ulong)uVar2;
          distnumextra._2_2_ =
               (short)lVar20 * 0x400 |
               (short)uVar9 + 0x10 +
               (short)((lVar20 + -1) * 2 + (uVar19 >> ((byte)(iVar10 - 1U) & 0x3f) & 1) <<
                      (bVar5 & 0x3f)) + ((ushort)uVar19 & (short)(1 << (bVar5 & 0x1f)) - 1U);
        }
        fVar1 = model->cost_dist_[(int)(distnumextra._2_2_ & 0x3ff)];
        dist._4_4_ = BVar3.length_and_code;
        BVar21.distance = dist._4_4_ >> 5;
        BVar21.length_and_code = 0;
        if (((ulong)match < (ulong)BVar21) &&
           ((local_458 < uVar17 || ((ulong)(long)iVar6 < (ulong)BVar21)))) {
          match = BVar21;
        }
        for (; (ulong)match <= (ulong)BVar21; match = (BackwardMatch)((long)match + 1)) {
          if (local_458 < uVar17) {
            local_490.distance = dist._4_4_ & 0x1f;
            local_490.length_and_code = 0;
            if (local_490 == (BackwardMatch)0x0) {
              local_490.distance = dist._4_4_ >> 5;
              local_490.length_and_code = 0;
            }
            local_498 = local_490;
          }
          else {
            local_498 = match;
          }
          uVar8 = local_498.distance;
          if ((ulong)local_498 < 10) {
            local_1fa = (short)local_498.distance - 2;
          }
          else if ((ulong)local_498 < 0x86) {
            iVar10 = 0x1f;
            if (uVar8 - 6 != 0) {
              for (; uVar8 - 6 >> iVar10 == 0; iVar10 = iVar10 + -1) {
              }
            }
            local_1fa = (short)(iVar10 + -1) * 2 +
                        (short)((long)local_498 - 6U >> ((byte)(iVar10 + -1) & 0x3f)) + 4;
          }
          else if ((ulong)local_498 < 0x846) {
            iVar10 = 0x1f;
            if (uVar8 - 0x46 != 0) {
              for (; uVar8 - 0x46 >> iVar10 == 0; iVar10 = iVar10 + -1) {
              }
            }
            local_1fa = (short)iVar10 + 0xc;
          }
          else {
            local_1fa = 0x17;
          }
          iVar10 = ((int)(uint)local_1fa >> 3) + ((int)(uint)local_222 >> 3) * 3;
          fVar24 = fVar23 + (float)(distnumextra._2_2_ >> 10) + fVar1 + (float)kCopyExtra[local_1fa]
                   + model->cost_cmd_
                     [(ushort)((short)iVar10 * 0x40 + 0x40 +
                               ((ushort)(0x520d40 >> ((char)iVar10 * '\x02' & 0x1fU)) & 0xc0) |
                              local_1fa & 7 | (local_222 & 7) << 3)];
          if (fVar24 < nodes[pos + (long)match].u.cost) {
            pZVar18 = nodes + pos + (long)match;
            pZVar18->length = match.distance | ((match.distance + 9) - uVar8) * 0x2000000;
            pZVar18->distance = BVar3.distance;
            pZVar18->dcode_insert_length = (int)pos - iVar4;
            (pZVar18->u).cost = fVar24;
            if ((ulong)match < k) {
              local_4a8.distance = (undefined4)k;
              local_4a8.length_and_code = k._4_4_;
            }
            else {
              local_4a8 = match;
            }
            k._0_4_ = local_4a8.distance;
            k._4_4_ = local_4a8.length_and_code;
          }
        }
      }
    }
    gap = gap + 1;
  } while( true );
LAB_0013657a:
  local_170 = local_170 + 1;
  limit2 = limit2 + 8;
  goto LAB_00136518;
}

Assistant:

static size_t UpdateNodes(
    const size_t num_bytes, const size_t block_start, const size_t pos,
    const uint8_t* ringbuffer, const size_t ringbuffer_mask,
    const BrotliEncoderParams* params, const size_t max_backward_limit,
    const int* starting_dist_cache, const size_t num_matches,
    const BackwardMatch* matches, const ZopfliCostModel* model,
    StartPosQueue* queue, ZopfliNode* nodes) {
  const size_t stream_offset = params->stream_offset;
  const size_t cur_ix = block_start + pos;
  const size_t cur_ix_masked = cur_ix & ringbuffer_mask;
  const size_t max_distance = BROTLI_MIN(size_t, cur_ix, max_backward_limit);
  const size_t dictionary_start = BROTLI_MIN(size_t,
      cur_ix + stream_offset, max_backward_limit);
  const size_t max_len = num_bytes - pos;
  const size_t max_zopfli_len = MaxZopfliLen(params);
  const size_t max_iters = MaxZopfliCandidates(params);
  size_t min_len;
  size_t result = 0;
  size_t k;
  size_t gap = 0;

  EvaluateNode(block_start + stream_offset, pos, max_backward_limit, gap,
      starting_dist_cache, model, queue, nodes);

  {
    const PosData* posdata = StartPosQueueAt(queue, 0);
    float min_cost = (posdata->cost + ZopfliCostModelGetMinCostCmd(model) +
        ZopfliCostModelGetLiteralCosts(model, posdata->pos, pos));
    min_len = ComputeMinimumCopyLength(min_cost, nodes, num_bytes, pos);
  }

  /* Go over the command starting positions in order of increasing cost
     difference. */
  for (k = 0; k < max_iters && k < StartPosQueueSize(queue); ++k) {
    const PosData* posdata = StartPosQueueAt(queue, k);
    const size_t start = posdata->pos;
    const uint16_t inscode = GetInsertLengthCode(pos - start);
    const float start_costdiff = posdata->costdiff;
    const float base_cost = start_costdiff + (float)GetInsertExtra(inscode) +
        ZopfliCostModelGetLiteralCosts(model, 0, pos);

    /* Look for last distance matches using the distance cache from this
       starting position. */
    size_t best_len = min_len - 1;
    size_t j = 0;
    for (; j < BROTLI_NUM_DISTANCE_SHORT_CODES && best_len < max_len; ++j) {
      const size_t idx = kDistanceCacheIndex[j];
      const size_t backward =
          (size_t)(posdata->distance_cache[idx] + kDistanceCacheOffset[j]);
      size_t prev_ix = cur_ix - backward;
      size_t len = 0;
      uint8_t continuation = ringbuffer[cur_ix_masked + best_len];
      if (cur_ix_masked + best_len > ringbuffer_mask) {
        break;
      }
      if (BROTLI_PREDICT_FALSE(backward > dictionary_start + gap)) {
        /* Word dictionary -> ignore. */
        continue;
      }
      if (backward <= max_distance) {
        /* Regular backward reference. */
        if (prev_ix >= cur_ix) {
          continue;
        }

        prev_ix &= ringbuffer_mask;
        if (prev_ix + best_len > ringbuffer_mask ||
            continuation != ringbuffer[prev_ix + best_len]) {
          continue;
        }
        len = FindMatchLengthWithLimit(&ringbuffer[prev_ix],
                                       &ringbuffer[cur_ix_masked],
                                       max_len);
      } else {
        /* "Gray" area. It is addressable by decoder, but this encoder
           instance does not have that data -> should not touch it. */
        continue;
      }
      {
        const float dist_cost = base_cost +
            ZopfliCostModelGetDistanceCost(model, j);
        size_t l;
        for (l = best_len + 1; l <= len; ++l) {
          const uint16_t copycode = GetCopyLengthCode(l);
          const uint16_t cmdcode =
              CombineLengthCodes(inscode, copycode, j == 0);
          const float cost = (cmdcode < 128 ? base_cost : dist_cost) +
              (float)GetCopyExtra(copycode) +
              ZopfliCostModelGetCommandCost(model, cmdcode);
          if (cost < nodes[pos + l].u.cost) {
            UpdateZopfliNode(nodes, pos, start, l, l, backward, j + 1, cost);
            result = BROTLI_MAX(size_t, result, l);
          }
          best_len = l;
        }
      }
    }

    /* At higher iterations look only for new last distance matches, since
       looking only for new command start positions with the same distances
       does not help much. */
    if (k >= 2) continue;

    {
      /* Loop through all possible copy lengths at this position. */
      size_t len = min_len;
      for (j = 0; j < num_matches; ++j) {
        BackwardMatch match = matches[j];
        size_t dist = match.distance;
        BROTLI_BOOL is_dictionary_match =
            TO_BROTLI_BOOL(dist > dictionary_start + gap);
        /* We already tried all possible last distance matches, so we can use
           normal distance code here. */
        size_t dist_code = dist + BROTLI_NUM_DISTANCE_SHORT_CODES - 1;
        uint16_t dist_symbol;
        uint32_t distextra;
        uint32_t distnumextra;
        float dist_cost;
        size_t max_match_len;
        PrefixEncodeCopyDistance(
            dist_code, params->dist.num_direct_distance_codes,
            params->dist.distance_postfix_bits, &dist_symbol, &distextra);
        distnumextra = dist_symbol >> 10;
        dist_cost = base_cost + (float)distnumextra +
            ZopfliCostModelGetDistanceCost(model, dist_symbol & 0x3FF);

        /* Try all copy lengths up until the maximum copy length corresponding
           to this distance. If the distance refers to the static dictionary, or
           the maximum length is long enough, try only one maximum length. */
        max_match_len = BackwardMatchLength(&match);
        if (len < max_match_len &&
            (is_dictionary_match || max_match_len > max_zopfli_len)) {
          len = max_match_len;
        }
        for (; len <= max_match_len; ++len) {
          const size_t len_code =
              is_dictionary_match ? BackwardMatchLengthCode(&match) : len;
          const uint16_t copycode = GetCopyLengthCode(len_code);
          const uint16_t cmdcode = CombineLengthCodes(inscode, copycode, 0);
          const float cost = dist_cost + (float)GetCopyExtra(copycode) +
              ZopfliCostModelGetCommandCost(model, cmdcode);
          if (cost < nodes[pos + len].u.cost) {
            UpdateZopfliNode(nodes, pos, start, len, len_code, dist, 0, cost);
            result = BROTLI_MAX(size_t, result, len);
          }
        }
      }
    }
  }
  return result;
}